

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O2

int pt_pkt_decode_unknown(pt_packet_decoder *decoder,pt_packet *packet)

{
  int iVar1;
  
  iVar1 = pt_pkt_read_unknown(packet,decoder->pos,&decoder->config);
  return iVar1;
}

Assistant:

static int pt_pkt_decode_unknown(struct pt_packet_decoder *decoder,
				 struct pt_packet *packet)
{
	int size;

	if (!decoder)
		return -pte_internal;

	size = pt_pkt_read_unknown(packet, decoder->pos, &decoder->config);
	if (size < 0)
		return size;

	return size;
}